

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_assertions.h
# Opt level: O3

void cgreen::assert_that_<char*>
               (char *file,int line,char *actual_string,char *actual,Constraint *constraint)

{
  char *__s1;
  int iVar1;
  char *local_38;
  
  __s1 = _create_with_side_effect_constraint;
  local_38 = actual;
  if (_create_with_side_effect_constraint != "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE")
  {
    if (*_create_with_side_effect_constraint == '*') {
      if (_create_with_side_effect_constraint !=
          "PNSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE" &&
          _create_with_side_effect_constraint !=
          "PKNSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") {
LAB_0010d1d2:
        cgreen::assert_that_(file,line,actual_string,(long)actual,constraint);
        return;
      }
    }
    else {
      iVar1 = strcmp(_create_with_side_effect_constraint,
                     "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE");
      if (__s1 != "PKNSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE" && iVar1 != 0) {
        iVar1 = strcmp(__s1,"PKNSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE");
        if ((__s1 != "PNSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") && (iVar1 != 0)) {
          iVar1 = strcmp(__s1,"PNSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE");
          if (iVar1 != 0) {
            iVar1 = strcmp(__s1,"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE");
            if (iVar1 == 0) {
              cgreen::assert_that_(file,line,actual_string,(string *)&local_38,constraint);
              return;
            }
            goto LAB_0010d1d2;
          }
        }
      }
    }
  }
  cgreen::assert_that_(file,line,actual_string,(string *)actual,constraint);
  return;
}

Assistant:

void assert_that_(const char *file, int line, const char *actual_string, T actual, Constraint *constraint) {

        if (typeid(actual) == typeid(std::string&) ||
            typeid(actual) == typeid(const std::string&) ||
            typeid(actual) == typeid(const std::string*) ||
            typeid(actual) == typeid(std::string*)) {

            assert_that_(file, line, actual_string, reinterpret_cast<const std::string *>(actual), constraint);

        } else if (typeid(actual) == typeid(std::string)) {

            assert_that_(file, line, actual_string, (const std::string *)&actual, constraint);

        } else {
            // TODO: update actual_string with output from operator<< of (T)actual
            assert_that_(file, line, actual_string, (intptr_t)actual, constraint);
        }
    }